

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::reserve
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this,size_t n)

{
  memory_resource *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  if (this->nAlloc < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n,1);
    if (this->nStored != 0) {
      uVar3 = 0;
      do {
        ((uchar *)CONCAT44(extraout_var,iVar2))[uVar3] = this->ptr[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->nStored);
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc,1);
    this->nAlloc = n;
    this->ptr = (uchar *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }